

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int sftp_cmd_ls(sftp_command *cmd)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  sftp_request *psVar6;
  sftp_packet *psVar7;
  fxp_handle *handle;
  list_directory_from_sftp_ctx *ctx_00;
  fxp_names *names_00;
  ulong local_80;
  size_t i;
  list_directory_from_sftp_ctx *ctx;
  char *san;
  _Bool check;
  int len;
  char *tmpdir;
  sftp_request *req;
  sftp_packet *pktin;
  char *wildcard;
  char *unwcdir;
  char *cdir;
  char *dir;
  fxp_names *names;
  fxp_handle *dirh;
  sftp_command *cmd_local;
  
  if (backend == (Backend *)0x0) {
    not_connected();
    cmd_local._4_4_ = 0;
  }
  else {
    if (cmd->nwords < 2) {
      cdir = ".";
    }
    else {
      cdir = cmd->words[1];
    }
    sVar3 = strlen(cdir);
    pcVar4 = (char *)safemalloc(sVar3 + 1,1,0);
    _Var1 = wc_unescape(pcVar4,cdir);
    if (_Var1) {
      pktin = (sftp_packet *)0x0;
      cdir = pcVar4;
    }
    else {
      safefree(pcVar4);
      pktin = (sftp_packet *)stripslashes(cdir,false);
      pcVar4 = dupstr(cdir);
      iVar2 = (int)pktin - (int)cdir;
      pcVar4[iVar2] = '\0';
      if ((0 < iVar2) && (pcVar4[iVar2 + -1] == '/')) {
        pcVar4[iVar2 + -1] = '\0';
      }
      pcVar5 = (char *)safemalloc((long)(iVar2 + 1),1,0);
      _Var1 = wc_unescape(pcVar5,pcVar4);
      safefree(pcVar5);
      cdir = pcVar4;
      if (!_Var1) {
        printf("Multiple-level wildcards are not supported\n");
        safefree(pcVar4);
        return 0;
      }
    }
    pcVar4 = canonify(cdir);
    ctx = (list_directory_from_sftp_ctx *)stripctrl_string(string_scc,pcVar4);
    while (ctx != (list_directory_from_sftp_ctx *)0x0) {
      printf("Listing directory %s\n",ctx);
      safefree(ctx);
      ctx = (list_directory_from_sftp_ctx *)0x0;
    }
    psVar6 = fxp_opendir_send(pcVar4);
    psVar7 = sftp_wait_for_reply(psVar6);
    handle = fxp_opendir_recv(psVar7,psVar6);
    if (handle == (fxp_handle *)0x0) {
      pcVar5 = fxp_error();
      printf("Unable to open %s: %s\n",cdir,pcVar5);
      safefree(pcVar4);
      safefree(cdir);
      cmd_local._4_4_ = 0;
    }
    else {
      ctx_00 = list_directory_from_sftp_new();
      while( true ) {
        psVar6 = fxp_readdir_send(handle);
        psVar7 = sftp_wait_for_reply(psVar6);
        names_00 = fxp_readdir_recv(psVar7,psVar6);
        if (names_00 == (fxp_names *)0x0) break;
        if (names_00->nnames == 0) {
          fxp_free_names(names_00);
          goto LAB_00110edf;
        }
        for (local_80 = 0; local_80 < (ulong)(long)names_00->nnames; local_80 = local_80 + 1) {
          if ((pktin == (sftp_packet *)0x0) ||
             (iVar2 = wc_match((char *)pktin,names_00->names[local_80].filename), iVar2 != 0)) {
            list_directory_from_sftp_feed(ctx_00,names_00->names + local_80);
          }
        }
        fxp_free_names(names_00);
      }
      iVar2 = fxp_error_type();
      if (iVar2 != 1) {
        pcVar5 = fxp_error();
        printf("Reading directory %s: %s\n",cdir,pcVar5);
      }
LAB_00110edf:
      psVar6 = fxp_close_send(handle);
      psVar7 = sftp_wait_for_reply(psVar6);
      fxp_close_recv(psVar7,psVar6);
      list_directory_from_sftp_finish(ctx_00);
      list_directory_from_sftp_free(ctx_00);
      safefree(pcVar4);
      safefree(cdir);
      cmd_local._4_4_ = 1;
    }
  }
  return cmd_local._4_4_;
}

Assistant:

int sftp_cmd_ls(struct sftp_command *cmd)
{
    struct fxp_handle *dirh;
    struct fxp_names *names;
    const char *dir;
    char *cdir, *unwcdir, *wildcard;
    struct sftp_packet *pktin;
    struct sftp_request *req;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 2)
        dir = ".";
    else
        dir = cmd->words[1];

    unwcdir = snewn(1 + strlen(dir), char);
    if (wc_unescape(unwcdir, dir)) {
        dir = unwcdir;
        wildcard = NULL;
    } else {
        char *tmpdir;
        int len;
        bool check;

        sfree(unwcdir);
        wildcard = stripslashes(dir, false);
        unwcdir = dupstr(dir);
        len = wildcard - dir;
        unwcdir[len] = '\0';
        if (len > 0 && unwcdir[len-1] == '/')
            unwcdir[len-1] = '\0';
        tmpdir = snewn(1 + len, char);
        check = wc_unescape(tmpdir, unwcdir);
        sfree(tmpdir);
        if (!check) {
            printf("Multiple-level wildcards are not supported\n");
            sfree(unwcdir);
            return 0;
        }
        dir = unwcdir;
    }

    cdir = canonify(dir);

    with_stripctrl(san, cdir)
        printf("Listing directory %s\n", san);

    req = fxp_opendir_send(cdir);
    pktin = sftp_wait_for_reply(req);
    dirh = fxp_opendir_recv(pktin, req);

    if (dirh == NULL) {
        printf("Unable to open %s: %s\n", dir, fxp_error());
        sfree(cdir);
        sfree(unwcdir);
        return 0;
    } else {
        struct list_directory_from_sftp_ctx *ctx =
            list_directory_from_sftp_new();

        while (1) {

            req = fxp_readdir_send(dirh);
            pktin = sftp_wait_for_reply(req);
            names = fxp_readdir_recv(pktin, req);

            if (names == NULL) {
                if (fxp_error_type() == SSH_FX_EOF)
                    break;
                printf("Reading directory %s: %s\n", dir, fxp_error());
                break;
            }
            if (names->nnames == 0) {
                fxp_free_names(names);
                break;
            }

            for (size_t i = 0; i < names->nnames; i++)
                if (!wildcard || wc_match(wildcard, names->names[i].filename))
                    list_directory_from_sftp_feed(ctx, &names->names[i]);

            fxp_free_names(names);
        }

        req = fxp_close_send(dirh);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);

        list_directory_from_sftp_finish(ctx);
        list_directory_from_sftp_free(ctx);
    }

    sfree(cdir);
    sfree(unwcdir);

    return 1;
}